

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O0

void __thiscall V2DCFilter::renderMono(V2DCFilter *this,float *dest,float *src,int nsamples)

{
  float fVar1;
  int local_34;
  V2DCF VStack_30;
  int i;
  V2DCF l;
  float R;
  int nsamples_local;
  float *src_local;
  float *dest_local;
  V2DCFilter *this_local;
  
  l.xm1 = this->inst->SRfcdcfilter;
  VStack_30 = this->fl;
  l.ym1 = (float)nsamples;
  for (local_34 = 0; local_34 < (int)l.ym1; local_34 = local_34 + 1) {
    fVar1 = V2DCF::step(&stack0xffffffffffffffd0,src[local_34],l.xm1);
    dest[local_34] = fVar1;
  }
  this->fl = VStack_30;
  return;
}

Assistant:

void renderMono(float *dest, const float *src, int nsamples)
    {
        float R = inst->SRfcdcfilter;

        V2DCF l = fl;
        for (int i=0; i < nsamples; i++)
            dest[i] = l.step(src[i], R);
        fl = l;
    }